

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::rlc_mr(GB *this,u16 mr)

{
  long lVar1;
  u8 uVar2;
  u16 mr_local;
  GB *this_local;
  
  lVar1 = (this->s).op_tick;
  if (lVar1 == 0x16) {
    uVar2 = Read(this,mr);
    (this->s).field_6.field_0.z = uVar2;
  }
  else if (lVar1 == 0x1e) {
    uVar2 = rlc(this,(this->s).field_6.field_0.z);
    Write(this,mr,uVar2);
    op_done(this);
  }
  return;
}

Assistant:

void GB::rlc_mr(u16 mr) {
  switch (s.op_tick) {
    case 22: s.z = Read(mr); break;
    case 30: Write(mr, rlc(s.z)); op_done(); break;
  }
}